

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_internal_cleanup_file(mcpl_fileinternal_t *f)

{
  char *pcVar1;
  uint32_t i;
  ulong uVar2;
  
  if (f != (mcpl_fileinternal_t *)0x0) {
    if (f->hdr_srcprogname != (char *)0x0) {
      free(f->hdr_srcprogname);
      f->hdr_srcprogname = (char *)0x0;
    }
    if (f->comments != (char **)0x0) {
      for (uVar2 = 0; uVar2 < f->ncomments; uVar2 = uVar2 + 1) {
        pcVar1 = f->comments[uVar2];
        if (pcVar1 != (char *)0x0) {
          free(pcVar1);
          f->comments[uVar2] = (char *)0x0;
        }
      }
      free(f->comments);
      f->comments = (char **)0x0;
    }
    if (f->blobkeys != (char **)0x0) {
      for (uVar2 = 0; uVar2 < f->nblobs; uVar2 = uVar2 + 1) {
        pcVar1 = f->blobkeys[uVar2];
        if (pcVar1 != (char *)0x0) {
          free(pcVar1);
          f->blobkeys[uVar2] = (char *)0x0;
        }
      }
      free(f->blobkeys);
      f->blobkeys = (char **)0x0;
    }
    if (f->blobs != (char **)0x0) {
      for (uVar2 = 0; uVar2 < f->nblobs; uVar2 = uVar2 + 1) {
        pcVar1 = f->blobs[uVar2];
        if (pcVar1 != (char *)0x0) {
          free(pcVar1);
          f->blobs[uVar2] = (char *)0x0;
        }
      }
      free(f->blobs);
      f->blobs = (char **)0x0;
    }
    if (f->bloblengths != (uint32_t *)0x0) {
      free(f->bloblengths);
      f->bloblengths = (uint32_t *)0x0;
    }
    if (f->particle != (mcpl_particle_t *)0x0) {
      free(f->particle);
      f->particle = (mcpl_particle_t *)0x0;
    }
    if (f->filegz != (gzFile)0x0) {
      gzclose();
      f->filegz = (gzFile)0x0;
    }
    if ((FILE *)f->file != (FILE *)0x0) {
      fclose((FILE *)f->file);
    }
    free(f);
    return;
  }
  return;
}

Assistant:

MCPL_LOCAL void mcpl_internal_cleanup_file(mcpl_fileinternal_t * f)
{
  if (!f)
    return;
  if ( f->hdr_srcprogname ) {
    free(f->hdr_srcprogname);
    f->hdr_srcprogname = NULL;
  }
  if ( f->comments ) {
    uint32_t i;
    for (i = 0; i < f->ncomments; ++i) {
      if ( f->comments[i] ) {
        free(f->comments[i]);
        f->comments[i] = NULL;
      }
    }
    free(f->comments);
    f->comments = NULL;
  }
  if ( f->blobkeys ) {
    for ( uint32_t i = 0; i < f->nblobs; ++i ) {
      if ( f->blobkeys[i] ) {
        free(f->blobkeys[i]);
        f->blobkeys[i] = NULL;
      }
    }
    free(f->blobkeys);
    f->blobkeys = NULL;
  }
  if ( f->blobs ) {
    for ( uint32_t i = 0; i < f->nblobs; ++i ) {
      if ( f->blobs[i] ) {
        free(f->blobs[i]);
        f->blobs[i] = NULL;
      }
    }
    free(f->blobs);
    f->blobs = NULL;
  }

  if ( f->bloblengths ) {
    free(f->bloblengths);
    f->bloblengths = NULL;
  }
  if ( f->particle ) {
    free(f->particle);
    f->particle = NULL;
  }
  if (f->filegz) {
    gzclose(f->filegz);
    f->filegz = NULL;
  }
  if (f->file) {
    fclose(f->file);
    f->file = NULL;
  }
  free(f);
}